

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O2

lyd_node * lyd_parse_data_(ly_ctx *ctx,char *data,LYD_FORMAT format,int options,__va_list_tag *ap)

{
  uint uVar1;
  lyd_node *plVar2;
  int iVar3;
  lyxml_elem *in_RAX;
  LY_ERR *pLVar4;
  long *plVar5;
  lyd_node *plVar6;
  lyd_node *plVar7;
  char *pcVar8;
  char *format_00;
  lyxml_elem *local_38;
  
  local_38 = in_RAX;
  iVar3 = lyp_check_options(options);
  if (iVar3 != 0) {
    pLVar4 = ly_errno_location();
    *pLVar4 = LY_EINVAL;
    format_00 = "%s: Invalid options (multiple data type flags set).";
LAB_00155bab:
    pcVar8 = "lyd_parse_data_";
    goto LAB_00155bb2;
  }
  if ((options & 0x20U) == 0) {
    plVar6 = (lyd_node *)0x0;
  }
  else {
    uVar1 = ap->gp_offset;
    if ((ulong)uVar1 < 0x29) {
      plVar5 = (long *)((ulong)uVar1 + (long)ap->reg_save_area);
      ap->gp_offset = uVar1 + 8;
    }
    else {
      plVar5 = (long *)ap->overflow_arg_area;
      ap->overflow_arg_area = plVar5 + 1;
    }
    plVar6 = (lyd_node *)*plVar5;
    if (((plVar6 == (lyd_node *)0x0) || (plVar6->parent != (lyd_node *)0x0)) ||
       ((plVar6->schema->nodetype & (LYS_RPC|LYS_LIST|LYS_CONTAINER)) == LYS_UNKNOWN)) {
      pLVar4 = ly_errno_location();
      *pLVar4 = LY_EINVAL;
      format_00 = "%s: invalid variable parameter (const struct lyd_node *rpc_act).";
      goto LAB_00155bab;
    }
  }
  if ((options & 0x70U) == 0) {
LAB_00155aea:
    plVar7 = (lyd_node *)0x0;
  }
  else {
    uVar1 = ap->gp_offset;
    if ((ulong)uVar1 < 0x29) {
      plVar5 = (long *)((ulong)uVar1 + (long)ap->reg_save_area);
      ap->gp_offset = uVar1 + 8;
    }
    else {
      plVar5 = (long *)ap->overflow_arg_area;
      ap->overflow_arg_area = plVar5 + 1;
    }
    plVar2 = (lyd_node *)*plVar5;
    plVar7 = plVar2;
    if (plVar2 == (lyd_node *)0x0) goto LAB_00155aea;
    for (; plVar7 != (lyd_node *)0x0; plVar7 = plVar7->next) {
      if (plVar7->parent != (lyd_node *)0x0) {
        pLVar4 = ly_errno_location();
        *pLVar4 = LY_EINVAL;
        format_00 = "%s: invalid variable parameter (const struct lyd_node *data_tree).";
        goto LAB_00155bab;
      }
    }
    do {
      plVar7 = plVar2;
      plVar2 = plVar7->prev;
    } while (plVar7->prev->next != (lyd_node *)0x0);
    if (((uint)options >> 0xc & 1) != 0) {
      pLVar4 = ly_errno_location();
      *pLVar4 = LY_EINVAL;
      format_00 = 
      "%s: invalid parameter (variable arg const struct lyd_node *data_tree with LYD_OPT_NOSIBLINGS)."
      ;
      goto LAB_00155bab;
    }
  }
  if (ctx != (ly_ctx *)0x0 && data != (char *)0x0) {
    if (format == LYD_JSON) {
      plVar6 = lyd_parse_json(ctx,data,options,plVar6,plVar7);
    }
    else {
      if (format != LYD_XML) {
        return (lyd_node *)0x0;
      }
      local_38 = lyxml_parse_mem(ctx,data,(uint)(((uint)options >> 0xc & 1) == 0));
      pLVar4 = ly_errno_location();
      if (*pLVar4 != LY_SUCCESS) {
        return (lyd_node *)0x0;
      }
      if ((options & 0x20U) == 0) {
        if ((options & 0x50U) == 0) {
          plVar6 = lyd_parse_xml(ctx,&local_38,options);
        }
        else {
          plVar6 = lyd_parse_xml(ctx,&local_38,options,plVar7);
        }
      }
      else {
        plVar6 = lyd_parse_xml(ctx,&local_38,options,plVar6,plVar7);
      }
      lyxml_free_withsiblings(ctx,local_38);
    }
    pLVar4 = ly_errno_location();
    if (*pLVar4 != LY_SUCCESS) {
      lyd_free_withsiblings(plVar6);
      return (lyd_node *)0x0;
    }
    return plVar6;
  }
  pLVar4 = ly_errno_location();
  *pLVar4 = LY_EINVAL;
  format_00 = "%s: Invalid parameter.";
  pcVar8 = "lyd_parse_";
LAB_00155bb2:
  ly_log(LY_LLERR,format_00,pcVar8);
  return (lyd_node *)0x0;
}

Assistant:

static struct lyd_node *
lyd_parse_data_(struct ly_ctx *ctx, const char *data, LYD_FORMAT format, int options, va_list ap)
{
    const struct lyd_node *rpc_act = NULL, *data_tree = NULL, *iter;

    if (lyp_check_options(options)) {
        LOGERR(LY_EINVAL, "%s: Invalid options (multiple data type flags set).", __func__);
        return NULL;
    }

    if (options & LYD_OPT_RPCREPLY) {
        rpc_act = va_arg(ap, const struct lyd_node *);
        if (!rpc_act || rpc_act->parent || !(rpc_act->schema->nodetype & (LYS_RPC | LYS_LIST | LYS_CONTAINER))) {
            LOGERR(LY_EINVAL, "%s: invalid variable parameter (const struct lyd_node *rpc_act).", __func__);
            return NULL;
        }
    }
    if (options & (LYD_OPT_RPC | LYD_OPT_NOTIF | LYD_OPT_RPCREPLY)) {
        data_tree = va_arg(ap, const struct lyd_node *);
        if (data_tree) {
            LY_TREE_FOR(data_tree, iter) {
                if (iter->parent) {
                    /* a sibling is not top-level */
                    LOGERR(LY_EINVAL, "%s: invalid variable parameter (const struct lyd_node *data_tree).", __func__);
                    return NULL;
                }
            }

            /* move it to the beginning */
            for (; data_tree->prev->next; data_tree = data_tree->prev);

            /* LYD_OPT_NOSIBLINGS cannot be set in this case */
            if (options & LYD_OPT_NOSIBLINGS) {
                LOGERR(LY_EINVAL, "%s: invalid parameter (variable arg const struct lyd_node *data_tree with LYD_OPT_NOSIBLINGS).", __func__);
                return NULL;
            }
        }
    }

    return lyd_parse_(ctx, rpc_act, data, format, options, data_tree);
}